

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<double,long,std::vector<double,std::allocator<double>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  long *plVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  unsigned_long *puVar7;
  long *plVar8;
  long lVar9;
  size_t sVar10;
  ulong *puVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble lVar14;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar15;
  longdouble lVar16;
  longdouble local_114;
  longdouble local_100;
  longdouble local_dc;
  longdouble local_d0;
  longdouble local_c4;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  lVar9 = Xc_indptr[col_num];
  lVar3 = Xc_indptr[col_num + 1];
  if (lVar9 != lVar3) {
    local_114 = (longdouble)0;
    for (sVar10 = st; sVar10 <= end; sVar10 = sVar10 + 1) {
      local_114 = local_114 +
                  (longdouble)
                  (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[ix_arr[sVar10]];
    }
    local_c4 = (longdouble)0;
    if (local_c4 < local_114) {
      plVar1 = Xc_ind + lVar3;
      uVar4 = plVar1[-1];
      puVar11 = ix_arr + end + 1;
      puVar7 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                         (ix_arr + st,puVar11,Xc_ind + lVar9);
      if (missing_action == Fail) {
        local_100 = (longdouble)0;
        local_dc = local_100;
        local_d0 = local_100;
        local_c4 = local_100;
        do {
          puVar2 = (ulong *)(Xc_ind + lVar9);
          while( true ) {
            if (((puVar7 == puVar11) || (lVar9 == lVar3)) || (uVar5 = *puVar7, uVar4 < uVar5))
            goto LAB_001db348;
            if (*puVar2 == uVar5) break;
            lVar12 = in_ST1;
            lVar13 = in_ST2;
            lVar14 = in_ST3;
            if ((long)*puVar2 <= (long)uVar5) goto LAB_001db30b;
            puVar7 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar7 + 1,puVar11,puVar2);
          }
          lVar12 = in_ST4;
          lVar13 = in_ST4;
          lVar14 = in_ST4;
          fmal();
          fmal();
          lVar15 = lVar14;
          fmal();
          fmal();
          local_100 = in_ST0;
          local_dc = in_ST1;
          local_d0 = in_ST2;
          local_c4 = in_ST3;
          if ((puVar7 == ix_arr + end) || (lVar9 == lVar3 + -1)) goto LAB_001db348;
          puVar7 = puVar7 + 1;
          in_ST0 = in_ST4;
          in_ST4 = lVar15;
LAB_001db30b:
          in_ST3 = lVar14;
          in_ST2 = lVar13;
          in_ST1 = lVar12;
          plVar8 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar2 + 1,plVar1,puVar7);
          lVar9 = (long)plVar8 - (long)Xc_ind >> 3;
        } while( true );
      }
      local_100 = (longdouble)0;
      local_dc = local_100;
      local_d0 = local_100;
      do {
        puVar2 = (ulong *)(Xc_ind + lVar9);
LAB_001dafc9:
        if (((puVar7 == puVar11) || (lVar9 == lVar3)) || (uVar5 = *puVar7, uVar4 < uVar5)) {
LAB_001db192:
          if (local_114 <= (longdouble)0) {
            return -INFINITY;
          }
LAB_001db348:
          if (local_114 <= (longdouble)1) {
            return -INFINITY;
          }
          if ((local_dc == (longdouble)0) && (!NAN(local_dc) && !NAN((longdouble)0))) {
            return -INFINITY;
          }
          if ((local_dc == local_100 * local_100) && (!NAN(local_dc) && !NAN(local_100 * local_100))
             ) {
            return -INFINITY;
          }
          lVar12 = local_100 / local_114;
          lVar13 = lVar12 * lVar12;
          lVar14 = local_dc / local_114 - lVar13;
          if (NAN(lVar14)) {
            return -INFINITY;
          }
          if ((lVar14 <= (longdouble)2.220446e-16) &&
             (bVar6 = check_more_than_two_unique_values<double,long>
                                (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar6))
          {
            return -INFINITY;
          }
          if (lVar14 <= (longdouble)0) {
            return 0.0;
          }
          lVar12 = (lVar13 * lVar12 * lVar12 * local_114 +
                   local_100 * (longdouble)-4.0 * lVar13 * lVar12 +
                   local_dc * (longdouble)6.0 * lVar13 +
                   local_c4 + local_d0 * (longdouble)-4.0 * lVar12) / (lVar14 * lVar14 * local_114);
          local_78 = SUB108(lVar12,0);
          uStack_70 = (ushort)((unkuint10)lVar12 >> 0x40);
          if (((unkuint10)lVar12 & 0x7fff) == 0 ||
              (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) {
            if ((double)lVar12 <= 0.0) {
              return 0.0;
            }
            return (double)lVar12;
          }
          return -INFINITY;
        }
        if (*puVar2 != uVar5) {
          if ((long)*puVar2 <= (long)uVar5) goto LAB_001db161;
          puVar7 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar7 + 1,puVar11,puVar2);
          goto LAB_001dafc9;
        }
        lVar12 = (longdouble)Xc[lVar9];
        local_68 = SUB108(lVar12,0);
        uStack_60 = (ushort)((unkuint10)lVar12 >> 0x40);
        if ((NAN(Xc[lVar9])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000)) {
          local_114 = local_114 -
                      (longdouble)
                      (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar5];
          lVar12 = in_ST0;
          lVar13 = in_ST1;
          lVar14 = in_ST2;
          lVar15 = in_ST3;
        }
        else {
          lVar13 = in_ST4;
          lVar14 = in_ST4;
          lVar15 = in_ST4;
          fmal();
          fmal();
          lVar16 = lVar15;
          fmal();
          fmal();
          lVar12 = in_ST4;
          in_ST4 = lVar16;
          local_100 = in_ST0;
          local_dc = in_ST1;
          local_d0 = in_ST2;
          local_c4 = in_ST3;
        }
        in_ST3 = lVar15;
        in_ST2 = lVar14;
        in_ST1 = lVar13;
        in_ST0 = lVar12;
        if ((puVar7 == ix_arr + end) || (lVar9 == lVar3 + -1)) goto LAB_001db192;
        puVar7 = puVar7 + 1;
LAB_001db161:
        plVar8 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar2 + 1,plVar1,puVar7);
        lVar9 = (long)plVar8 - (long)Xc_ind >> 3;
      } while( true );
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}